

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddEssent.c
# Opt level: O2

DdTlcInfo * computeClausesWithUniverse(DdTlcInfo *Cres,DdHalfWord label,short phase)

{
  DdHalfWord DVar1;
  DdHalfWord *pDVar2;
  long *plVar3;
  ulong uVar4;
  long lVar5;
  uint uVar6;
  DdTlcInfo *t;
  DdHalfWord *__ptr;
  BitVector *vector;
  byte bVar7;
  uint uVar8;
  ushort val;
  ulong uVar9;
  long lVar10;
  
  pDVar2 = Cres->vars;
  plVar3 = Cres->phases;
  t = tlcInfoAlloc();
  if (t != (DdTlcInfo *)0x0) {
    lVar5 = 1;
    do {
      lVar10 = lVar5;
      lVar5 = lVar10 + 2;
    } while (pDVar2[lVar10] != 0 || pDVar2[lVar10 + -1] != 0);
    __ptr = (DdHalfWord *)malloc((lVar10 + 3U & 0xffffffff) << 2);
    if ((__ptr != (DdHalfWord *)0x0) &&
       (vector = bitVectorAlloc((int)(lVar10 + 3U)), vector != (BitVector *)0x0)) {
      t->vars = __ptr;
      t->phases = vector;
      uVar9 = 0;
      while( true ) {
        DVar1 = pDVar2[uVar9 + 1];
        uVar6 = (uint)uVar9;
        if (DVar1 == 0 && pDVar2[uVar9] == 0) break;
        __ptr[uVar9] = pDVar2[uVar9];
        __ptr[uVar9 + 1] = DVar1;
        if (plVar3 == (long *)0x0) {
          val = 0;
          bitVectorSet(vector,uVar6,0);
        }
        else {
          uVar4 = plVar3[uVar9 >> 6 & 0x3ffffff];
          bitVectorSet(vector,uVar6,(ushort)((uVar4 >> (uVar6 & 0x3e) & 1) != 0));
          val = (ushort)((uVar4 >> (uVar9 + 1 & 0x3f) & 1) != 0);
        }
        bitVectorSet(vector,uVar6 + 1,val);
        uVar9 = uVar9 + 2;
      }
      __ptr[uVar9] = label;
      bitVectorSet(vector,uVar6,phase);
      __ptr[uVar9 + 1] = 0x7fffffff;
      bitVectorSet(vector,uVar6 + 1,1);
      uVar8 = uVar6 + 2;
      __ptr[uVar8] = 0;
      uVar6 = uVar6 + 3;
      __ptr[uVar6] = 0;
      bVar7 = (byte)uVar8 & 0x3e;
      vector[uVar8 >> 6] = vector[uVar8 >> 6] & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7)
      ;
      bVar7 = (byte)uVar6 & 0x3f;
      vector[uVar6 >> 6] = vector[uVar6 >> 6] & (-2L << bVar7 | 0xfffffffffffffffeU >> 0x40 - bVar7)
      ;
      return t;
    }
    free(__ptr);
    Cudd_tlcInfoFree(t);
  }
  return (DdTlcInfo *)0x0;
}

Assistant:

static DdTlcInfo *
computeClausesWithUniverse(
  DdTlcInfo *Cres /* list of clauses for child */,
  DdHalfWord label /* variable labeling the current node */,
  short phase /* 0 if E child is zero; 1 if T child is zero */)
{
    DdHalfWord *Ccv = Cres->vars; /* variables of clauses for child */
    BitVector *Ccp = Cres->phases; /* phases of clauses for child */
    DdHalfWord *Vcv = NULL; /* pointer to the variables of the clauses for v */
    BitVector *Vcp = NULL; /* pointer to the phases of the clauses for v */
    DdTlcInfo *res = NULL; /* the set of clauses to be returned */
    int i;

    /* Initialize result. */
    res = tlcInfoAlloc();
    if (res == NULL) goto cleanup;
    /* Count entries for new list and allocate accordingly. */
    for (i = 0; !sentinelp(Ccv[i], Ccv[i+1]); i += 2);
    /* At this point, i is twice the number of clauses in the child's
    ** list.  We need four more entries for this node: 2 for the one-literal
    ** clause for the label, and 2 for the sentinel. */
    Vcv = ABC_ALLOC(DdHalfWord,i+4);
    if (Vcv == NULL) goto cleanup;
    Vcp = bitVectorAlloc(i+4);
    if (Vcp == NULL) goto cleanup;
    res->vars = Vcv;
    res->phases = Vcp;
    /* Copy old list into new. */
    for (i = 0; !sentinelp(Ccv[i], Ccv[i+1]); i += 2) {
        Vcv[i] = Ccv[i];
        Vcv[i+1] = Ccv[i+1];
        bitVectorSet(Vcp, i, bitVectorRead(Ccp, i));
        bitVectorSet(Vcp, i+1, bitVectorRead(Ccp, i+1));
    }
    /* Add clause corresponding to label. */
    Vcv[i] = label;
    bitVectorSet(Vcp, i, phase);
    i++;
    Vcv[i] = CUDD_MAXINDEX;
    bitVectorSet(Vcp, i, 1);
    i++;
    /* Add sentinel. */
    Vcv[i] = 0;
    Vcv[i+1] = 0;
    bitVectorSet(Vcp, i, 0);
    bitVectorSet(Vcp, i+1, 0);

    return(res);

 cleanup:
    /* Vcp is guaranteed to be NULL here.  Hence, we do not try to free it. */
    if (Vcv != NULL) ABC_FREE(Vcv);
    if (res != NULL) Cudd_tlcInfoFree(res);

    return(NULL);

}